

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImVec2 ImLineClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *p)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = a->x;
  fVar2 = a->y;
  fVar5 = b->x - fVar1;
  fVar4 = b->y - fVar2;
  fVar6 = (p->x - fVar1) * fVar5 + (p->y - fVar2) * fVar4;
  if (fVar6 < 0.0) {
    return *a;
  }
  fVar7 = fVar5 * fVar5 + fVar4 * fVar4;
  if (fVar7 < fVar6) {
    return *b;
  }
  IVar3.x = fVar1 + (fVar5 * fVar6) / fVar7;
  IVar3.y = fVar2 + (fVar4 * fVar6) / fVar7;
  return IVar3;
}

Assistant:

static inline ImVec2 operator-(const ImVec2& lhs, const ImVec2& rhs)            { return ImVec2(lhs.x-rhs.x, lhs.y-rhs.y); }